

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterial_substrate(SemanticParser *this,SP *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  runtime_error *this_00;
  long *plVar6;
  element_type *peVar7;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  vec3f *result;
  _Base_ptr this_01;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  float fVar11;
  undefined1 auVar12 [16];
  SP SVar13;
  SP mat;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  SubstrateMaterial *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  undefined1 local_128 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  SP *local_100;
  SemanticParser *local_f8;
  string local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_d0;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = (SubstrateMaterial *)0x0;
  local_100 = in;
  local_f8 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::SubstrateMaterial,std::allocator<pbrt::SubstrateMaterial>,std::__cxx11::string&>
            (&_Stack_130,&local_138,(allocator<pbrt::SubstrateMaterial> *)&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  std::__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::SubstrateMaterial,pbrt::SubstrateMaterial>
            ((__shared_ptr<pbrt::SubstrateMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             local_138);
  p_Var9 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var10 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var8._M_pi = extraout_RDX;
  if (p_Var9 != p_Var10) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_d0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var9 + 1));
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_d0.first._M_dataplus._M_p,
                 local_d0.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_d0.first._M_string_length);
      iVar5 = std::__cxx11::string::compare((char *)&local_f0);
      if (iVar5 == 0) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_f0);
        if (bVar4) {
          (local_138->kd).x = 1.0;
          (local_138->kd).y = 1.0;
          (local_138->kd).z = 1.0;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_60,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_128,(SP *)local_100);
          uVar3 = local_128._8_8_;
          uVar2 = local_128._0_8_;
          local_128._0_8_ = (element_type *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var1 = (local_138->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (local_138->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar2;
          (local_138->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          this_01 = (_Base_ptr)local_60._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
            this_01 = (_Base_ptr)local_60._8_8_;
          }
          goto LAB_0013e782;
        }
        result = &local_138->kd;
LAB_0013e637:
        syntactic::ParamSet::getParam3f((ParamSet *)*in_RDX,&result->x,&local_f0);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_f0);
        if (iVar5 == 0) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_f0);
          if (!bVar4) {
            result = &local_138->ks;
            goto LAB_0013e637;
          }
          (local_138->ks).x = 1.0;
          (local_138->ks).y = 1.0;
          (local_138->ks).z = 1.0;
          syntactic::ParamSet::getParamTexture((ParamSet *)local_70,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_128,(SP *)local_100);
          uVar3 = local_128._8_8_;
          uVar2 = local_128._0_8_;
          local_128._0_8_ = (element_type *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var1 = (local_138->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (local_138->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar2;
          (local_138->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          this_01 = (_Base_ptr)local_70._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
            this_01 = (_Base_ptr)local_70._8_8_;
          }
LAB_0013e782:
          if (this_01 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_f0);
          if (iVar5 == 0) {
            bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_f0);
            if (bVar4) {
              *(undefined4 *)
               &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138->uRoughness)->_M_pi =
                   0x3f800000;
              syntactic::ParamSet::getParamTexture((ParamSet *)local_80,(string *)*in_RDX);
              findOrCreateTexture((SemanticParser *)local_128,(SP *)local_100);
              uVar3 = local_128._8_8_;
              uVar2 = local_128._0_8_;
              local_128._0_8_ = (element_type *)0x0;
              local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var1 = (((SP *)&local_138->map_uRoughness)->
                       super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
              (((SP *)&local_138->map_uRoughness)->
              super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)uVar2;
              (((SP *)&local_138->map_uRoughness)->
              super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              this_01 = (_Base_ptr)local_80._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
                this_01 = (_Base_ptr)local_80._8_8_;
              }
              goto LAB_0013e782;
            }
            fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_f0,0.0);
            *(float *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138->uRoughness)->_M_pi
                 = fVar11;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_f0);
            if (iVar5 == 0) {
              bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_f0);
              if (bVar4) {
                *(undefined4 *)
                 &(((SP *)&local_138->vRoughness)->
                  super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                     0x3f800000;
                syntactic::ParamSet::getParamTexture((ParamSet *)local_90,(string *)*in_RDX);
                findOrCreateTexture((SemanticParser *)local_128,(SP *)local_100);
                uVar3 = local_128._8_8_;
                uVar2 = local_128._0_8_;
                local_128._0_8_ = (element_type *)0x0;
                local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var1 = (local_138->map_vRoughness).
                         super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
                (local_138->map_vRoughness).
                super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)uVar2;
                (local_138->map_vRoughness).
                super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
                if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                }
                this_01 = (_Base_ptr)local_90._8_8_;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
                  this_01 = (_Base_ptr)local_90._8_8_;
                }
                goto LAB_0013e782;
              }
              fVar11 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_f0,0.0);
              *(float *)&(((SP *)&local_138->vRoughness)->
                         super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   fVar11;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)&local_f0);
              if (iVar5 == 0) {
                bVar4 = syntactic::ParamSet::getParamBool((ParamSet *)*in_RDX,&local_f0,false);
                *(bool *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138->remapRoughness)
                          ->_M_pi = bVar4;
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)&local_f0);
                if (iVar5 == 0) {
                  syntactic::ParamSet::getParamTexture((ParamSet *)local_a0,(string *)*in_RDX);
                  findOrCreateTexture((SemanticParser *)local_128,(SP *)local_100);
                  uVar3 = local_128._8_8_;
                  uVar2 = local_128._0_8_;
                  local_128._0_8_ = (element_type *)0x0;
                  local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var1 = (local_138->map_bump).
                           super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
                  (local_138->map_bump).
                  super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)uVar2;
                  (local_138->map_bump).
                  super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
                  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                  }
                  this_01 = (_Base_ptr)local_a0._8_8_;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
                    this_01 = (_Base_ptr)local_a0._8_8_;
                  }
                  goto LAB_0013e782;
                }
                iVar5 = std::__cxx11::string::compare((char *)&local_f0);
                if (iVar5 != 0) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&local_50,"un-handled substrate-material parameter \'",
                                 &local_d0.first);
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
                  local_128._0_8_ = *plVar6;
                  peVar7 = (element_type *)(plVar6 + 2);
                  if ((element_type *)local_128._0_8_ == peVar7) {
                    local_128._16_8_ = (peVar7->super_Entity)._vptr_Entity;
                    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[3];
                    local_128._0_8_ = (element_type *)(local_128 + 0x10);
                  }
                  else {
                    local_128._16_8_ = (peVar7->super_Entity)._vptr_Entity;
                  }
                  local_128._8_8_ = plVar6[1];
                  *plVar6 = (long)peVar7;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  std::runtime_error::runtime_error(this_00,(string *)local_128);
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_d0.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
        operator_delete(local_d0.first._M_dataplus._M_p,
                        local_d0.first.field_2._M_allocated_capacity + 1);
      }
      auVar12 = std::_Rb_tree_increment(p_Var9);
      _Var8._M_pi = auVar12._8_8_;
      p_Var9 = auVar12._0_8_;
    } while (p_Var9 != p_Var10);
  }
  (local_f8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_f8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_138;
  (local_f8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_130._M_pi;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f8;
  return (SP)SVar13.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_substrate(pbrt::syntactic::Material::SP in)
  {
    SubstrateMaterial::SP mat = std::make_shared<SubstrateMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name)) {
          mat->uRoughness = 1.f;
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name)) {
          mat->vRoughness = 1.f;
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled substrate-material parameter '"+it.first+"'");
    };
    return mat;
  }